

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

string __thiscall
mjs::anon_unknown_35::do_replace
          (anon_unknown_35 *this,string *str,value *match_val,value *replace_value)

{
  gc_heap *this_00;
  uint *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  value *extraout_RDX;
  value *extraout_RDX_00;
  string sVar4;
  object_ptr match;
  wstring res;
  string match_str;
  wstring s;
  value match_index_val;
  gc_heap_ptr_untyped local_e8;
  wstring_view local_d8;
  long local_c8 [2];
  undefined1 local_b8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_b0;
  gc_heap_ptr_untyped local_90;
  long *local_80 [2];
  long local_70 [2];
  gc_heap *local_60;
  value local_58;
  
  if (match_val->type_ == object) {
    local_e8.heap_ =
         (match_val->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_e8.pos_ = *(uint32_t *)((long)&match_val->field_1 + 8);
    if (local_e8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_e8.heap_,&local_e8);
    }
    puVar1 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
    local_80[0] = local_70;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)local_80,puVar1 + 1,puVar1 + (ulong)*puVar1 + 1);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e8);
    local_b8 = (undefined1  [8])0x5;
    local_b0.n_ = 8.48288975021003e-318;
    (**(code **)*puVar2)(&local_58,puVar2);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e8);
    local_d8._M_len = 1;
    local_d8._M_str = L"0";
    (**(code **)*puVar2)(local_b8,puVar2);
    if (local_b8._0_4_ != L'\x04') {
      __assert_fail("type_ == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x45,"const string &mjs::value::string_value() const");
    }
    local_90.heap_ = (gc_heap *)local_b0.n_;
    local_90.pos_ = local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if (local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
                      &local_90);
    }
    value::destroy((value *)local_b8);
    if (local_58.type_ != number) {
      __assert_fail("type_ == value_type::number",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x44,"double mjs::value::number_value() const");
    }
    gc_heap_ptr_untyped::get(&local_90);
    local_60 = local_e8.heap_;
    local_b8 = (undefined1  [8])
               &local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    local_b0.n_ = 0.0;
    local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = 0;
    std::__cxx11::wstring::substr((ulong)&local_d8,(ulong)local_80);
    std::__cxx11::wstring::operator=((wstring *)local_b8,(wstring *)&local_d8);
    if ((long *)local_d8._M_len != local_c8) {
      operator_delete((void *)local_d8._M_len,local_c8[0] * 4 + 4);
    }
    do_get_replacement_string
              ((anon_unknown_35 *)&local_d8,str,(object_ptr *)&local_e8,replace_value);
    pvVar3 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_d8);
    std::__cxx11::wstring::append((wchar_t *)local_b8,(long)pvVar3 + 4);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d8);
    std::__cxx11::wstring::substr((ulong)&local_d8,(ulong)local_80);
    std::__cxx11::wstring::_M_append((wchar_t *)local_b8,local_d8._M_len);
    if ((long *)local_d8._M_len != local_c8) {
      operator_delete((void *)local_d8._M_len,local_c8[0] * 4 + 4);
    }
    local_d8._M_len = (size_t)local_b0.n_;
    local_d8._M_str = (wchar_t *)local_b8;
    string::string((string *)this,local_60,&local_d8);
    if (local_b8 !=
        (undefined1  [8])
        &local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_) {
      operator_delete((void *)local_b8,
                      CONCAT44(local_b0._12_4_,
                               local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_) * 4 + 4);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    value::destroy(&local_58);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] * 4 + 4);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    match_val = extraout_RDX_00;
  }
  else {
    if (match_val->type_ != null) {
      __assert_fail("match_val.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                    ,0x163,
                    "string mjs::(anonymous namespace)::do_replace(const string &, const value &, const value &)"
                   );
    }
    this_00 = (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
    *(gc_heap **)this = this_00;
    *(uint32_t *)(this + 8) =
         (str->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
      match_val = extraout_RDX;
    }
  }
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = match_val;
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_replace(const string& str, const value& match_val, const value& replace_value) {
    if (match_val.type() == value_type::null) {
        return str;
    }
    assert(match_val.type() == value_type::object);
    const auto match           = match_val.object_value();
    const auto s               = std::wstring{str.view()};
    const auto match_index_val = match->get(L"index");
    const auto match_str       = match->get(L"0").string_value();
    const auto match_index     = static_cast<uint32_t>(match_index_val.number_value());
    const auto match_length    = static_cast<uint32_t>(match_str.view().length());

    auto& h = match.heap();

    std::wstring res;
    res = s.substr(0, match_index);
    res += do_get_replacement_string(str, match, replace_value).view();
    res += s.substr(match_index + match_length);
    return string{h, res};
}